

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminatablethread.cpp
# Opt level: O1

void __thiscall TerminatableThread::~TerminatableThread(TerminatableThread *this)

{
  this->_vptr_TerminatableThread = (_func_int **)&PTR__TerminatableThread_00242c60;
  if ((this->m_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->m_thread)._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

TerminatableThread::~TerminatableThread() { join(); }